

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O1

bool QFileSystemEngine::mkpath
               (QFileSystemEntry *entry,optional<QFlags<QFileDevice::Permission>_> permissions)

{
  mode_t mode;
  qsizetype qVar1;
  QSystemError QVar2;
  int *piVar3;
  bool bVar4;
  long in_FS_OFFSET;
  QMessageLogger local_58;
  NativePath local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::nativeFilePath(&local_38,entry);
  if ((undefined1 *)local_38.d.size == (undefined1 *)0x0) {
    local_58.context.version = 2;
    local_58.context._4_8_ = 0;
    local_58.context._12_8_ = 0;
    local_58.context.function._4_4_ = 0;
    local_58.context.category = "default";
    QMessageLogger::warning(&local_58,"Empty filename passed to function");
  }
  else {
    qVar1 = QByteArray::indexOf(&local_38,'\0',0);
    if (qVar1 == -1) {
      mode = 0x1ff;
      if (((ulong)permissions.super__Optional_base<QFlags<QFileDevice::Permission>,_true,_true>.
                  _M_payload.super__Optional_payload_base<QFlags<QFileDevice::Permission>_> >> 0x20
          & 1) != 0) {
        mode = QtPrivate::toMode_t(permissions.
                                   super__Optional_base<QFlags<QFileDevice::Permission>,_true,_true>
                                   ._M_payload.
                                   super__Optional_payload_base<QFlags<QFileDevice::Permission>_>.
                                   _M_payload._M_value);
      }
      removeTrailingSlashes(&local_38);
      QVar2 = createDirectoryWithParents(&local_38,mode);
      bVar4 = (ulong)QVar2 >> 0x20 == 0;
      goto LAB_003c2b13;
    }
    local_58.context.version = 2;
    local_58.context._4_8_ = 0;
    local_58.context._12_8_ = 0;
    local_58.context.function._4_4_ = 0;
    local_58.context.category = "default";
    QMessageLogger::warning(&local_58,"Broken filename passed to function");
  }
  piVar3 = __errno_location();
  *piVar3 = 0x16;
  bVar4 = false;
LAB_003c2b13:
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemEngine::mkpath(const QFileSystemEntry &entry,
                              std::optional<QFile::Permissions> permissions)
{
    QByteArray path = entry.nativeFilePath();
    Q_CHECK_FILE_NAME(path, false);

    mode_t mode = permissions ? QtPrivate::toMode_t(*permissions) : 0777;
    return createDirectoryWithParents(removeTrailingSlashes(path), mode).ok();
}